

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::CompilationCompletionNonParallelTest::iterate(CompilationCompletionNonParallelTest *this)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  char *pcVar4;
  qpTestResult testResult;
  TestContext *this_00;
  GLint completionStatus;
  int fLengths [1];
  int vLengths [1];
  char *fSources [1];
  char *vSources [1];
  Program program;
  Shader fragmentShader;
  Shader vertexShader;
  Functions *gl;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_parallel_shader_compile");
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar2);
    (*gl->maxShaderCompilerThreadsARB)(0);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"maxShaderCompilerThreadsARB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xd6);
    glu::Program::Program(&program,gl);
    glu::Shader::Shader(&vertexShader,gl,SHADERTYPE_VERTEX);
    glu::Shader::Shader(&fragmentShader,gl,SHADERTYPE_FRAGMENT);
    vSources[0] = 
    "#version 450\n\nin vec3 vertex;\n\nint main() {\n    gl_Position = vec4(vertex, 1);\n}\n";
    vLengths[0] = 0x51;
    glu::Shader::setSources(&vertexShader,1,vSources,vLengths);
    fSources[0] = 
    "#version 450\n\nout ver4 fragColor;\n\nint main() {\n    fragColor = vec4(1, 1, 1, 1);\n}\n";
    fLengths[0] = 0x54;
    glu::Shader::setSources(&fragmentShader,1,fSources,fLengths);
    (*gl->compileShader)(vertexShader.m_shader);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xe6);
    (*gl->compileShader)(fragmentShader.m_shader);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xe8);
    (*gl->getShaderiv)(fragmentShader.m_shader,0x91b1,&completionStatus);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"getShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xeb);
    if (completionStatus == 0) {
      pcVar4 = "Failed reading completion status for non parallel shader compiling";
    }
    else {
      glu::Program::attachShader(&program,vertexShader.m_shader);
      glu::Program::attachShader(&program,fragmentShader.m_shader);
      (*gl->linkProgram)(program.m_program);
      (*gl->getProgramiv)(program.m_program,0x91b1,&completionStatus);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"getProgramiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0xf8);
      if (completionStatus != 0) {
        glu::Shader::~Shader(&fragmentShader);
        glu::Shader::~Shader(&vertexShader);
        glu::Program::~Program(&program);
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar4 = "Pass";
        testResult = QP_TEST_RESULT_PASS;
        goto LAB_00ae55f4;
      }
      pcVar4 = "Failed reading completion status for non parallel program linking";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               pcVar4);
    glu::Shader::~Shader(&fragmentShader);
    glu::Shader::~Shader(&vertexShader);
    glu::Program::~Program(&program);
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar4 = "Not supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
LAB_00ae55f4:
    tcu::TestContext::setTestResult(this_00,testResult,pcVar4);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CompilationCompletionNonParallelTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint completionStatus;

	gl.maxShaderCompilerThreadsARB(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	{
		Program program(gl);
		Shader  vertexShader(gl, SHADERTYPE_VERTEX);
		Shader  fragmentShader(gl, SHADERTYPE_FRAGMENT);

		const char* vSources[] = { vShader };
		const int   vLengths[] = { int(strlen(vShader)) };
		vertexShader.setSources(1, vSources, vLengths);

		const char* fSources[] = { fShader };
		const int   fLengths[] = { int(strlen(fShader)) };
		fragmentShader.setSources(1, fSources, fLengths);

		gl.compileShader(vertexShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		gl.compileShader(fragmentShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");

		gl.getShaderiv(fragmentShader.getShader(), GL_COMPLETION_STATUS_ARB, &completionStatus);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getShaderiv");
		if (!completionStatus)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
									"Failed reading completion status for non parallel shader compiling");
			return STOP;
		}

		program.attachShader(vertexShader.getShader());
		program.attachShader(fragmentShader.getShader());
		gl.linkProgram(program.getProgram());

		gl.getProgramiv(program.getProgram(), GL_COMPLETION_STATUS_ARB, &completionStatus);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramiv");
		if (!completionStatus)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
									"Failed reading completion status for non parallel program linking");
			return STOP;
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}